

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsops.c
# Opt level: O0

LispPTR LCFetchMethodOrHelp(LispPTR object,LispPTR selector)

{
  LispPTR LVar1;
  int iVar2;
  LispPTR *pLVar3;
  LCMethodCacheEntry *pLVar4;
  LispPTR *pLVar5;
  LispPTR *pLVar6;
  LCClass *classptr;
  LispPTR *selectorptr;
  int local_38;
  LispPTR val;
  int i;
  LispPTR supers;
  LispPTR tmp;
  LispPTR cur_class;
  LCMethodCacheEntry *ce;
  LCInstance *objptr;
  LispPTR selector_local;
  LispPTR object_local;
  
  if (atom_instance == 0) {
    LCinit();
  }
  if (((*(uint *)(DTDspace +
                 (long)(int)((*(ushort *)((ulong)(MDStypetbl + (object >> 9)) ^ 2) & 0x7ff) << 4) +
                 (long)(int)((*(ushort *)((ulong)(MDStypetbl + (object >> 9)) ^ 2) & 0x7ff) << 1)) &
       0xfffffff) == atom_instance) ||
     ((*(uint *)(DTDspace +
                (long)(int)((*(ushort *)((ulong)(MDStypetbl + (object >> 9)) ^ 2) & 0x7ff) << 4) +
                (long)(int)((*(ushort *)((ulong)(MDStypetbl + (object >> 9)) ^ 2) & 0x7ff) << 1)) &
      0xfffffff) == atom_class)) {
    pLVar3 = NativeAligned4FromLAddr(object);
    supers = *pLVar3;
    pLVar4 = LCMethodCache + ((supers ^ selector) & 0x3ff);
    if ((pLVar4->class == supers) && (pLVar4->selector == selector)) {
      selector_local = pLVar4->method_fn;
    }
    else {
      pLVar5 = NativeAligned4FromLAddr(supers);
      val = pLVar5[8];
      while( true ) {
        local_38 = 0;
        pLVar5 = NativeAligned4FromLAddr(supers);
        if (pLVar5[0xb] != 0) {
          pLVar6 = NativeAligned4FromLAddr(pLVar5[0xb]);
          iVar2 = local_38;
          while( true ) {
            local_38 = iVar2;
            if (pLVar6[local_38] == 0) break;
            iVar2 = local_38 + 1;
            if (pLVar6[local_38] == selector) {
              pLVar4->class = *pLVar3;
              pLVar4->selector = selector;
              pLVar3 = NativeAligned4FromLAddr(pLVar5[0xc]);
              LVar1 = pLVar3[local_38];
              pLVar4->method_fn = LVar1;
              return LVar1;
            }
          }
        }
        supers = car(val);
        if (supers == 0) break;
        val = cdr(val);
      }
      selector_local = lcfuncall(atom_FetchMethodOrHelp_LCUFN,2,3);
    }
  }
  else {
    selector_local = lcfuncall(atom_FetchMethodOrHelp_LCUFN,2,3);
  }
  return selector_local;
}

Assistant:

LispPTR LCFetchMethodOrHelp(LispPTR object, LispPTR selector) {
  struct LCInstance *objptr;
  struct LCMethodCacheEntry *ce;
  LispPTR cur_class;

  LC_INIT;

  INSTANCE_CLASS_OR_PUNT(object, atom_FetchMethodOrHelp_LCUFN, 2);

  objptr = (struct LCInstance *)NativeAligned4FromLAddr(object);
  ce = &(LCMethodCache[METH_CACHE_INDEX((cur_class = objptr->class), selector)]);
  if (ce->class == cur_class && ce->selector == selector) return ce->method_fn;

  /* not in cache, search class then supers */
  {
    LispPTR supers = ((struct LCClass *)NativeAligned4FromLAddr(cur_class))->supers;

    for (;;) {
      int i = 0;
      LispPTR val;
      LispPTR *selectorptr;
      struct LCClass *classptr;

      classptr = (struct LCClass *)NativeAligned4FromLAddr(cur_class);
      if (classptr->selectors == NIL_PTR) {
        goto next_class;
      } else {
        selectorptr = (LispPTR *)NativeAligned4FromLAddr(classptr->selectors);
      }

      while ((val = selectorptr[i++]) != NIL_PTR) {
        if (val == selector) {
          ce->class = objptr->class;
          ce->selector = selector;
          return (ce->method_fn = ((LispPTR *)NativeAligned4FromLAddr(classptr->methods))[i - 1]);
        }
      }

    next_class:
      if ((cur_class = car(supers)) == NIL_PTR) break;
      supers = cdr(supers);
    }
  }

  /* we didn't find it at all; punt */
  RETCALL(atom_FetchMethodOrHelp_LCUFN, 2);

  /*  return lcfuncall(atom_FetchMethodOrHelp_LCUFN,2,3); */
  /*  return PUNT;*/
}